

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringElement.cpp
# Opt level: O1

ssize_t __thiscall StringElement::read(StringElement *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  string tmpStr;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  std::operator>>((istream *)CONCAT44(in_register_00000034,__fd),(string *)&local_30);
  std::__cxx11::string::_M_assign((string *)&this->_value);
  Object::setInitState(&(this->super_StreamObject).super_Object,true);
  uVar1 = extraout_RAX;
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    uVar1 = extraout_RAX_00;
  }
  return CONCAT71((int7)((ulong)uVar1 >> 8),1);
}

Assistant:

bool StringElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read string
	------------------------------------------*/

	std::string tmpStr;

	f >> tmpStr;

	_value = tmpStr;

	setInitState( true );

	return true;

}